

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O0

bool __thiscall cmDocumentation::PrintRequestedDocumentation(cmDocumentation *this,ostream *os)

{
  bool bVar1;
  pointer pRVar2;
  ulong uVar3;
  char *pcVar4;
  ostream *local_48;
  ostream *s;
  ofstream *fout;
  __normal_iterator<cmDocumentation::RequestedHelpItem_*,_std::vector<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>_>
  local_30;
  __normal_iterator<const_cmDocumentation::RequestedHelpItem_*,_std::vector<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>_>
  local_28;
  const_iterator i;
  bool result;
  int count;
  ostream *os_local;
  cmDocumentation *this_local;
  
  i._M_current._4_4_ = 0;
  i._M_current._3_1_ = 1;
  local_30._M_current =
       (RequestedHelpItem *)
       std::
       vector<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>
       ::begin(&this->RequestedHelpItems);
  __gnu_cxx::
  __normal_iterator<cmDocumentation::RequestedHelpItem_const*,std::vector<cmDocumentation::RequestedHelpItem,std::allocator<cmDocumentation::RequestedHelpItem>>>
  ::__normal_iterator<cmDocumentation::RequestedHelpItem*>
            ((__normal_iterator<cmDocumentation::RequestedHelpItem_const*,std::vector<cmDocumentation::RequestedHelpItem,std::allocator<cmDocumentation::RequestedHelpItem>>>
              *)&local_28,&local_30);
  while( true ) {
    fout = (ofstream *)
           std::
           vector<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>
           ::end(&this->RequestedHelpItems);
    bVar1 = __gnu_cxx::operator!=
                      (&local_28,
                       (__normal_iterator<cmDocumentation::RequestedHelpItem_*,_std::vector<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>_>
                        *)&fout);
    if (!bVar1) break;
    pRVar2 = __gnu_cxx::
             __normal_iterator<const_cmDocumentation::RequestedHelpItem_*,_std::vector<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>_>
             ::operator->(&local_28);
    std::__cxx11::string::operator=((string *)&this->CurrentArgument,(string *)&pRVar2->Argument);
    s = (ostream *)0x0;
    __gnu_cxx::
    __normal_iterator<const_cmDocumentation::RequestedHelpItem_*,_std::vector<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>_>
    ::operator->(&local_28);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      s = (ostream *)operator_new(0x200);
      __gnu_cxx::
      __normal_iterator<const_cmDocumentation::RequestedHelpItem_*,_std::vector<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>_>
      ::operator->(&local_28);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      std::ofstream::ofstream(s,pcVar4,_S_out);
      local_48 = s;
      if (s == (ostream *)0x0) {
        i._M_current._3_1_ = 0;
        local_48 = os;
      }
    }
    else {
      i._M_current._4_4_ = i._M_current._4_4_ + 1;
      local_48 = os;
      if (1 < i._M_current._4_4_) {
        std::operator<<(os,"\n\n");
        local_48 = os;
      }
    }
    pRVar2 = __gnu_cxx::
             __normal_iterator<const_cmDocumentation::RequestedHelpItem_*,_std::vector<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>_>
             ::operator->(&local_28);
    bVar1 = PrintDocumentation(this,pRVar2->HelpType,local_48);
    if ((!bVar1) ||
       (uVar3 = std::ios::operator!((ios *)((long)&local_48->_vptr_basic_ostream +
                                           (long)local_48->_vptr_basic_ostream[-3])),
       (uVar3 & 1) != 0)) {
      i._M_current._3_1_ = 0;
    }
    if ((s != (ostream *)0x0) && (s != (ostream *)0x0)) {
      (*s->_vptr_basic_ostream[1])();
    }
    __gnu_cxx::
    __normal_iterator<const_cmDocumentation::RequestedHelpItem_*,_std::vector<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>_>
    ::operator++(&local_28);
  }
  return (bool)(i._M_current._3_1_ & 1);
}

Assistant:

bool cmDocumentation::PrintRequestedDocumentation(std::ostream& os)
{
  int count = 0;
  bool result = true;

  // Loop over requested documentation types.
  for(std::vector<RequestedHelpItem>::const_iterator
      i = this->RequestedHelpItems.begin();
      i != this->RequestedHelpItems.end();
      ++i)
    {
    this->CurrentArgument = i->Argument;
    // If a file name was given, use it.  Otherwise, default to the
    // given stream.
    cmsys::ofstream* fout = 0;
    std::ostream* s = &os;
    if(!i->Filename.empty())
      {
      fout = new cmsys::ofstream(i->Filename.c_str(), std::ios::out);
      if(fout)
        {
        s = fout;
        }
      else
        {
        result = false;
        }
      }
    else if(++count > 1)
      {
      os << "\n\n";
      }

    // Print this documentation type to the stream.
    if(!this->PrintDocumentation(i->HelpType, *s) || !*s)
      {
      result = false;
      }

    // Close the file if we wrote one.
    if(fout)
      {
      delete fout;
      }
    }
  return result;
}